

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

string * __thiscall
cmake::LogLevelToString_abi_cxx11_(string *__return_storage_ptr__,cmake *this,LogLevel level)

{
  ulong uVar1;
  uint uVar2;
  string_view levelStrLowerCase;
  allocator<char> local_49;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string local_30;
  
  uVar2 = (int)this - 1;
  if (uVar2 < 7) {
    uVar1 = (ulong)(uVar2 * 0x18);
    local_48._M_len = *(size_t *)((anonymous_namespace)::getStringToLogLevelPairs()::levels + uVar1)
    ;
    local_48._M_str =
         *(char **)((anonymous_namespace)::getStringToLogLevelPairs()::levels + uVar1 + 8);
  }
  else {
    local_48._M_len = 9;
    local_48._M_str = "undefined";
  }
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_30,&local_48,&local_49);
  cmsys::SystemTools::UpperCase(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::LogLevelToString(Message::LogLevel level)
{
  const LevelsPairArray& levels = getStringToLogLevelPairs();

  // NOLINTNEXTLINE(readability-qualified-auto)
  const auto it =
    std::find_if(levels.cbegin(), levels.cend(),
                 [&level](const LevelsPair& p) { return p.second == level; });
  const cm::string_view levelStrLowerCase =
    (it != levels.cend()) ? it->first : "undefined";
  std::string levelStrUpperCase =
    cmSystemTools::UpperCase(std::string{ levelStrLowerCase });
  return levelStrUpperCase;
}